

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

void pybind11_meta_dealloc(PyObject *obj)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  internals *piVar4;
  iterator iVar5;
  _Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true> __it;
  local_internals *plVar6;
  key_type local_40;
  PyTypeObject *type;
  type_index tindex;
  
  local_40 = (key_type)obj;
  piVar4 = pybind11::detail::get_internals();
  iVar5 = std::
          _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(piVar4->registered_types_py)._M_h,&local_40);
  if (((iVar5.
        super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
        ._M_cur != (__node_type *)0x0) &&
      (*(long *)((long)iVar5.
                       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                       ._M_cur + 0x18) -
       (long)*(undefined8 **)
              ((long)iVar5.
                     super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                     ._M_cur + 0x10) == 8)) &&
     (plVar1 = (long *)**(undefined8 **)
                         ((long)iVar5.
                                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                ._M_cur + 0x10), (key_type)*plVar1 == local_40)) {
    type = (PyTypeObject *)plVar1[1];
    std::
    _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(piVar4->direct_conversions)._M_h);
    plVar6 = (local_internals *)piVar4;
    if (((*(byte *)(plVar1 + 0x12) & 8) != 0) &&
       (plVar6 = &pybind11::detail::get_local_internals::locals,
       pybind11::detail::get_local_internals()::locals == '\0')) {
      iVar3 = __cxa_guard_acquire(&pybind11::detail::get_local_internals()::locals);
      if (iVar3 != 0) {
        plVar6 = &pybind11::detail::get_local_internals::locals;
        pybind11::detail::local_internals::local_internals
                  (&pybind11::detail::get_local_internals::locals);
        __cxa_atexit(pybind11::detail::local_internals::~local_internals,
                     &pybind11::detail::get_local_internals::locals,&__dso_handle);
        __cxa_guard_release(&pybind11::detail::get_local_internals()::locals);
      }
    }
    std::
    _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)plVar6,&type);
    std::
    _Hashtable<_typeobject_*,_std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_typeobject_*>,_std::hash<_typeobject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(piVar4->registered_types_py)._M_h,plVar1);
    __it._M_cur = (__node_type *)(piVar4->inactive_override_cache)._M_h._M_before_begin._M_nxt;
    if (__it._M_cur != (__node_type *)0x0) {
      do {
        if (*(long *)((long)__it._M_cur + 8) == *plVar1) {
          __it._M_cur = (__node_type *)
                        std::
                        _Hashtable<std::pair<const__object_*,_const_char_*>,_std::pair<const__object_*,_const_char_*>,_std::allocator<std::pair<const__object_*,_const_char_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_pybind11::detail::override_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::erase(&(piVar4->inactive_override_cache)._M_h,__it._M_cur);
        }
        else {
          __it._M_cur = *__it._M_cur;
        }
      } while (__it._M_cur != (__node_type *)0x0);
    }
    pvVar2 = (void *)plVar1[0xb];
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,plVar1[0xd] - (long)pvVar2);
    }
    pvVar2 = (void *)plVar1[8];
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,plVar1[10] - (long)pvVar2);
    }
    operator_delete(plVar1,0x98);
  }
  (*__Rb_tree_rebalance_for_erase)(obj);
  return;
}

Assistant:

inline void pybind11_meta_dealloc(PyObject *obj) {
    auto *type = (PyTypeObject *) obj;
    auto &internals = get_internals();

    // A pybind11-registered type will:
    // 1) be found in internals.registered_types_py
    // 2) have exactly one associated `detail::type_info`
    auto found_type = internals.registered_types_py.find(type);
    if (found_type != internals.registered_types_py.end() &&
        found_type->second.size() == 1 &&
        found_type->second[0]->type == type) {

        auto *tinfo = found_type->second[0];
        auto tindex = std::type_index(*tinfo->cpptype);
        internals.direct_conversions.erase(tindex);

        if (tinfo->module_local)
            get_local_internals().registered_types_cpp.erase(tindex);
        else
            internals.registered_types_cpp.erase(tindex);
        internals.registered_types_py.erase(tinfo->type);

        // Actually just `std::erase_if`, but that's only available in C++20
        auto &cache = internals.inactive_override_cache;
        for (auto it = cache.begin(), last = cache.end(); it != last; ) {
            if (it->first == (PyObject *) tinfo->type)
                it = cache.erase(it);
            else
                ++it;
        }

        delete tinfo;
    }

    PyType_Type.tp_dealloc(obj);
}